

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_RequiredKeywordBanned_Test::
ParseEditionsTest_RequiredKeywordBanned_Test(ParseEditionsTest_RequiredKeywordBanned_Test *this)

{
  ParseEditionsTest_RequiredKeywordBanned_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseEditionsTest);
  (this->super_ParseEditionsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseEditionsTest_RequiredKeywordBanned_Test_02a11ab8;
  return;
}

Assistant:

TEST_F(ParseEditionsTest, RequiredKeywordBanned) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        message A {
          required int32 b = 1;
        })schema",
      "3:10: Label \"required\" is not supported in editions, use "
      "features.field_presence = LEGACY_REQUIRED.\n");
}